

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImVec2 *pIVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  undefined1 auVar8 [16];
  bool is_open;
  bool bVar9;
  ImU32 fill_col;
  int iVar10;
  int iVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *text_end;
  char *text_end_00;
  char *extraout_RDX_02;
  char *text_end_01;
  float fVar12;
  ulong uVar13;
  ImGuiContext *g;
  char *text;
  byte bVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  ImVec2 p_min;
  ImVec2 p_min_00;
  undefined8 extraout_XMM0_Qb;
  float fVar18;
  float fVar19;
  float fVar20;
  bool held;
  bool hovered;
  char log_suffix [3];
  ImRect bb;
  ImRect interact_bb;
  char log_prefix [4];
  ImVec2 text_pos;
  ImVec2 label_size;
  ImVec2 in_stack_fffffffffffffec8;
  bool local_11e;
  bool local_11d;
  ImGuiID local_11c;
  undefined1 local_118 [16];
  undefined1 local_104 [2];
  undefined1 local_102;
  char local_101;
  char *local_100;
  undefined1 local_f8 [16];
  ImVec2 local_e8;
  ImVec2 IStack_e0;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ImRect local_c8;
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  ImVec4 local_98;
  ImVec2 local_88;
  ImVec2 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar6 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  if (pIVar3->SkipItems != false) {
    return false;
  }
  local_48 = 0;
  if ((flags & 2U) != 0) {
    local_48 = (ulong)(uint)(pIVar6->Style).FramePadding.y;
  }
  uStack_40 = 0;
  if (label_end == (char *)0x0) {
    label_end = label;
    if (label != (char *)0xffffffffffffffff) {
      do {
        if (*label_end == '#') {
          if (label_end[1] == '#') goto LAB_0013e490;
        }
        else if (*label_end == '\0') goto LAB_0013e490;
        label_end = label_end + 1;
      } while (label_end != (char *)0xffffffffffffffff);
    }
    label_end = (char *)0xffffffffffffffff;
  }
LAB_0013e490:
  local_68 = ZEXT416((uint)(pIVar6->Style).FramePadding.x);
  local_11c = id;
  local_100 = label;
  local_80 = CalcTextSize(label,label_end,false,-1.0);
  fVar20 = (pIVar3->DC).CurrentLineHeight;
  fVar18 = (pIVar3->DC).CurrentLineTextBaseOffset - (float)local_48;
  fVar18 = (float)(~-(uint)(fVar18 <= 0.0) & (uint)fVar18);
  fVar19 = (pIVar6->Style).FramePadding.y;
  fVar19 = fVar19 + fVar19 + pIVar6->FontSize;
  if (fVar19 <= fVar20) {
    fVar20 = fVar19;
  }
  fVar19 = (float)local_48 + (float)local_48 + local_80.y;
  uVar15 = -(uint)(fVar19 <= fVar20);
  local_98.y = (float)(uVar15 & (uint)fVar20 | ~uVar15 & (uint)fVar19);
  fVar20 = (pIVar3->Pos).x;
  pIVar4 = GImGui->CurrentWindow;
  pIVar1 = &(pIVar4->ContentsRegionRect).Max;
  IStack_e0.x = pIVar1->x;
  local_78 = ZEXT416((uint)fVar18);
  fVar19 = local_80.x;
  if ((pIVar4->DC).ColumnsCount != 1) {
    local_a8._8_4_ = (int)extraout_XMM0_Qb;
    local_a8._0_4_ = local_80.x;
    local_a8._4_4_ = local_80.y;
    local_a8._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    local_f8 = ZEXT416((uint)local_98.y);
    local_118._8_8_ = 0;
    local_118._0_4_ = pIVar1->x;
    local_118._4_4_ = pIVar1->y;
    IStack_e0.x = GetColumnOffset((pIVar4->DC).ColumnsCurrent + 1);
    IStack_e0.x = IStack_e0.x - (pIVar4->WindowPadding).x;
    fVar18 = (float)local_78._0_4_;
    fVar19 = (float)local_a8._0_4_;
    local_98.y = (float)local_f8._0_4_;
  }
  local_e8 = (pIVar3->DC).CursorPos;
  IStack_e0.x = fVar20 + IStack_e0.x;
  fVar20 = local_e8.x;
  uVar13 = (ulong)local_e8 >> 0x20;
  fVar16 = (pIVar3->DC).CursorPos.y + local_98.y;
  fVar12 = local_e8.y;
  if ((flags & 2U) == 0) {
    local_d8 = 2.0;
  }
  else {
    fVar17 = (float)(int)((pIVar3->WindowPadding).x * 0.5) + -1.0;
    fVar20 = fVar20 - fVar17;
    local_e8.y = fVar12;
    local_e8.x = fVar20;
    IStack_e0.x = IStack_e0.x + fVar17;
    local_d8 = 3.0;
  }
  local_a8 = ZEXT416((uint)fVar20);
  local_118 = ZEXT416((uint)pIVar6->FontSize);
  local_98.x = (float)(-(uint)(0.0 < fVar19) &
                      (uint)((float)local_68._0_4_ + (float)local_68._0_4_ + fVar19)) +
               pIVar6->FontSize;
  _local_58 = ZEXT416((uint)local_98.x);
  IStack_e0.y = fVar16;
  ItemSize((ImVec2 *)&local_98,fVar18);
  local_f8._0_8_ = uVar13;
  if ((flags & 2U) == 0) {
    fVar20 = (pIVar6->Style).ItemSpacing.x;
    local_c8.Max.x = fVar20 + fVar20 + (float)local_58._0_4_ + (float)local_a8._0_4_;
    local_c8.Min.y = fVar12;
    local_c8.Min.x = (float)local_a8._0_4_;
    local_c8.Max.y = fVar16;
  }
  else {
    local_c8.Max.x = IStack_e0.x;
    local_c8.Max.y = IStack_e0.y;
    local_c8.Min = local_e8;
  }
  is_open = TreeNodeBehaviorIsOpen(local_11c,flags);
  bVar9 = ItemAdd(&local_c8,&local_11c);
  if (!bVar9) {
    if (!is_open || (char)((flags & 8U) >> 3) != '\0') {
      return is_open;
    }
    TreePushRawID(local_11c);
    return true;
  }
  local_118._0_4_ = (float)local_118._0_4_ + local_d8 * (float)local_68._0_4_;
  bVar9 = ButtonBehavior(&local_c8,local_11c,&local_11d,&local_11e,
                         (((uint)flags >> 6 & 2 | 0x10) & (flags << 0x19) >> 0x1f) +
                         (flags & 4U) * 0x100 + 0x200);
  auVar8 = local_f8;
  if ((((uint)flags >> 8 & 1) == 0) && (bVar9)) {
    bVar14 = (flags & 0xc0U) == 0;
    if ((char)flags < '\0') {
      local_d8 = (float)CONCAT31(local_d8._1_3_,(flags & 0xc0U) == 0);
      local_98.y = local_c8.Max.y;
      local_98.x = local_c8.Min.x + (float)local_118._0_4_;
      bVar9 = IsMouseHoveringRect(&local_c8.Min,(ImVec2 *)&local_98,true);
      bVar14 = bVar9 | local_d8._0_1_;
    }
    if ((flags & 0x40U) == 0) {
      if (bVar14 == 0) goto LAB_0013e83a;
    }
    else if (bVar14 == 0 && (pIVar6->IO).MouseDoubleClicked[0] == false) goto LAB_0013e83a;
    is_open = !is_open;
    ImGuiStorage::SetInt((pIVar3->DC).StateStorage,local_11c,(uint)is_open);
  }
LAB_0013e83a:
  pIVar7 = GImGui;
  local_f8 = ZEXT416(auVar8._0_4_);
  if ((flags & 4U) != 0) {
    IVar2 = (GImGui->CurrentWindow->DC).LastItemId;
    if (GImGui->HoveredId == IVar2) {
      GImGui->HoveredIdAllowOverlap = true;
    }
    if (pIVar7->ActiveId == IVar2) {
      pIVar7->ActiveIdAllowOverlap = true;
    }
  }
  pIVar7 = GImGui;
  iVar10 = ((local_11e ^ 1U) & local_11d) + 0x19;
  iVar11 = 0x1b;
  if ((local_11d & 1U) == 0) {
    iVar11 = iVar10;
  }
  if (local_11e == false) {
    iVar11 = iVar10;
  }
  pIVar1 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar11 << 4));
  local_98._0_8_ = *pIVar1;
  IVar5 = pIVar1[1];
  local_98.w = IVar5.y;
  local_98.z = IVar5.x;
  local_98.w = (GImGui->Style).Alpha * local_98.w;
  fill_col = ColorConvertFloat4ToU32(&local_98);
  local_d8 = (float)local_48 + (float)local_78._0_4_ + (float)local_f8._0_4_;
  uStack_d4 = local_48._4_4_;
  uStack_d0 = (undefined4)uStack_40;
  uStack_cc = uStack_40._4_4_;
  local_88.y = local_d8;
  local_88.x = (float)local_118._0_4_ + (float)local_a8._0_4_;
  if ((flags & 2U) == 0) {
    local_58._4_4_ = local_d8;
    local_58._0_4_ = (float)local_118._0_4_ + (float)local_a8._0_4_;
    uStack_50 = local_118._4_4_;
    uStack_4c = local_48._4_4_;
    text_end_01 = extraout_RDX;
    if (((flags & 1U) == 0 & (local_11d ^ 1U)) == 0) {
      local_b0.y = IStack_e0.y;
      local_b0.x = IStack_e0.x;
      local_98.x = local_e8.x;
      local_98.y = local_e8.y;
      pIVar3 = pIVar7->CurrentWindow;
      pIVar3->Accessed = true;
      if (0xffffff < fill_col) {
        this = pIVar3->DrawList;
        ImDrawList::PrimReserve(this,6,4);
        ImDrawList::PrimRect(this,(ImVec2 *)&local_98,&local_b0,fill_col);
        text_end_01 = extraout_RDX_00;
      }
    }
    text = local_100;
    if (((uint)flags >> 9 & 1) == 0) {
      if (((uint)flags >> 8 & 1) == 0) {
        p_min.x = (float)local_a8._0_4_ + (float)local_68._0_4_;
        p_min.y = (float)local_f8._0_4_ + pIVar6->FontSize * 0.15 + (float)local_78._0_4_;
        RenderCollapseTriangle(p_min,is_open,0.7,false);
        text_end_01 = extraout_RDX_01;
      }
    }
    else {
      RenderBullet(in_stack_fffffffffffffec8);
      text_end_01 = extraout_RDX_02;
      text = local_100;
    }
    if (pIVar6->LogEnabled == true) {
      LogRenderedText((ImVec2 *)0x1966a0,(char *)0x0,text_end_01);
    }
    RenderText((ImVec2)local_58,text,label_end,false);
  }
  else {
    local_118._8_8_ = 0;
    local_118._0_4_ = local_e8.x;
    local_118._4_4_ = local_e8.y;
    IVar5.y = IStack_e0.y;
    IVar5.x = IStack_e0.x;
    RenderFrame(local_e8,IVar5,fill_col,true,(pIVar6->Style).FrameRounding);
    p_min_00.x = (float)local_118._0_4_ + (float)local_68._0_4_ + 0.0;
    p_min_00.y = local_78._0_4_ + (float)local_f8._0_4_ + (float)local_48;
    RenderCollapseTriangle(p_min_00,is_open,1.0,true);
    if (pIVar6->LogEnabled == true) {
      local_b0.x = 3.226812e-39;
      local_102 = 0;
      local_104 = (undefined1  [2])0x2323;
      LogRenderedText(&local_b0,(char *)((long)&local_b0.x + 3),text_end);
      local_98.x = 0.0;
      local_98.y = 0.0;
      RenderTextClipped(&local_88,&IStack_e0,local_100,label_end,&local_80,(ImVec2 *)&local_98,
                        (ImRect *)0x0);
      LogRenderedText((ImVec2 *)(local_104 + 1),&local_101,text_end_00);
    }
    else {
      local_98.x = 0.0;
      local_98.y = 0.0;
      RenderTextClipped(&local_88,&IStack_e0,local_100,label_end,&local_80,(ImVec2 *)&local_98,
                        (ImRect *)0x0);
    }
  }
  if (is_open == true && (char)((flags & 8U) >> 3) == '\0') {
    TreePushRawID(local_11c);
  }
  return is_open;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = display_frame ? style.FramePadding : ImVec2(style.FramePadding.x, 0.0f);

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float text_base_offset_y = ImMax(0.0f, window->DC.CurrentLineTextBaseOffset - padding.y); // Latch before ItemSize changes it
    const float frame_height = ImMax(ImMin(window->DC.CurrentLineHeight, g.FontSize + style.FramePadding.y*2), label_size.y + padding.y*2);
    ImRect bb = ImRect(window->DC.CursorPos, ImVec2(window->Pos.x + GetContentRegionMax().x, window->DC.CursorPos.y + frame_height));
    if (display_frame)
    {
        // Framed header expand a little outside the default padding
        bb.Min.x -= (float)(int)(window->WindowPadding.x*0.5f) - 1;
        bb.Max.x += (float)(int)(window->WindowPadding.x*0.5f) - 1;
    }

    const float text_offset_x = (g.FontSize + (display_frame ? padding.x*3 : padding.x*2));   // Collapser arrow width + Spacing
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x*2 : 0.0f);   // Include collapser
    ItemSize(ImVec2(text_width, frame_height), text_base_offset_y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    // (Ideally we'd want to add a flag for the user to specify we want want the hit test to be done up to the right side of the content or not)
    const ImRect interact_bb = display_frame ? bb : ImRect(bb.Min.x, bb.Min.y, bb.Min.x + text_width + style.ItemSpacing.x*2, bb.Max.y);
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    if (!ItemAdd(interact_bb, &id))
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushRawID(id);
        return is_open;
    }

    // Flags that affects opening behavior:
    // - 0(default) ..................... single-click anywhere to open
    // - OpenOnDoubleClick .............. double-click anywhere to open
    // - OpenOnArrow .................... single-click on arrow to open
    // - OpenOnDoubleClick|OpenOnArrow .. single-click on arrow or double-click anywhere to open
    ImGuiButtonFlags button_flags = ImGuiButtonFlags_NoKeyModifiers | ((flags & ImGuiTreeNodeFlags_AllowOverlapMode) ? ImGuiButtonFlags_AllowOverlapMode : 0);
    if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnDoubleClick | ((flags & ImGuiTreeNodeFlags_OpenOnArrow) ? ImGuiButtonFlags_PressedOnClickRelease : 0);
    bool hovered, held, pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    if (pressed && !(flags & ImGuiTreeNodeFlags_Leaf))
    {
        bool toggled = !(flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick));
        if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
            toggled |= IsMouseHoveringRect(interact_bb.Min, ImVec2(interact_bb.Min.x + text_offset_x, interact_bb.Max.y));
        if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
            toggled |= g.IO.MouseDoubleClicked[0];
        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowOverlapMode)
        SetItemAllowOverlap();

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
    const ImVec2 text_pos = bb.Min + ImVec2(text_offset_x, padding.y + text_base_offset_y);
    if (display_frame)
    {
        // Framed type
        RenderFrame(bb.Min, bb.Max, col, true, style.FrameRounding);
        RenderCollapseTriangle(bb.Min + padding + ImVec2(0.0f, text_base_offset_y), is_open, 1.0f, true);
        if (g.LogEnabled)
        {
            // NB: '##' is normally used to hide text (as a library-wide feature), so we need to specify the text range to make sure the ## aren't stripped out here.
            const char log_prefix[] = "\n##";
            const char log_suffix[] = "##";
            LogRenderedText(text_pos, log_prefix, log_prefix+3);
            RenderTextClipped(text_pos, bb.Max, label, label_end, &label_size);
            LogRenderedText(text_pos, log_suffix+1, log_suffix+3);
        }
        else
        {
            RenderTextClipped(text_pos, bb.Max, label, label_end, &label_size);
        }
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || (flags & ImGuiTreeNodeFlags_Selected))
            RenderFrame(bb.Min, bb.Max, col, false);

        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(bb.Min + ImVec2(text_offset_x * 0.5f, g.FontSize*0.50f + text_base_offset_y));
        else if (!(flags & ImGuiTreeNodeFlags_Leaf))
            RenderCollapseTriangle(bb.Min + ImVec2(padding.x, g.FontSize*0.15f + text_base_offset_y), is_open, 0.70f, false);
        if (g.LogEnabled)
            LogRenderedText(text_pos, ">");
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushRawID(id);
    return is_open;
}